

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void free_entry(UResourceDataEntry *entry)

{
  UResourceDataEntry *local_18;
  UResourceDataEntry *alias;
  UResourceDataEntry *entry_local;
  
  res_unload_63(&entry->fData);
  if ((entry->fName != (char *)0x0) && (entry->fName != entry->fNameBuffer)) {
    uprv_free_63(entry->fName);
  }
  if (entry->fPath != (char *)0x0) {
    uprv_free_63(entry->fPath);
  }
  if (entry->fPool != (UResourceDataEntry *)0x0) {
    entry->fPool->fCountExisting = entry->fPool->fCountExisting - 1;
  }
  local_18 = entry->fAlias;
  if (local_18 != (UResourceDataEntry *)0x0) {
    for (; local_18->fAlias != (UResourceDataEntry *)0x0; local_18 = local_18->fAlias) {
    }
    local_18->fCountExisting = local_18->fCountExisting - 1;
  }
  uprv_free_63(entry);
  return;
}

Assistant:

static void
free_entry(UResourceDataEntry *entry) {
    UResourceDataEntry *alias;
    res_unload(&(entry->fData));
    if(entry->fName != NULL && entry->fName != entry->fNameBuffer) {
        uprv_free(entry->fName);
    }
    if(entry->fPath != NULL) {
        uprv_free(entry->fPath);
    }
    if(entry->fPool != NULL) {
        --entry->fPool->fCountExisting;
    }
    alias = entry->fAlias;
    if(alias != NULL) {
        while(alias->fAlias != NULL) {
            alias = alias->fAlias;
        }
        --alias->fCountExisting;
    }
    uprv_free(entry);
}